

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  int iVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar13;
  int iVar14;
  char *pcVar15;
  int16_t iVar16;
  uint uVar17;
  int32_t segNum;
  int iVar18;
  ulong size;
  long lVar19;
  long lVar20;
  char *__format;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  bool bVar28;
  short sVar29;
  undefined4 uVar30;
  short sVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  __m128i alVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar55 [16];
  ushort uVar56;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  undefined1 auVar58 [16];
  ushort uVar65;
  long local_c0;
  __m128i_16_t e;
  __m128i_16_t h;
  short sVar45;
  short sVar57;
  short sVar66;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar24 = profile->s1Len;
        if ((int)uVar24 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else {
          uVar22 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar15 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "open";
          }
          else {
            if (-1 < gap) {
              uVar11 = uVar24 - 1;
              size = (ulong)uVar24 + 7 >> 3;
              iVar26 = -open;
              iVar14 = ppVar4->min;
              iVar18 = -iVar14;
              if (iVar14 != iVar26 && SBORROW4(iVar14,iVar26) == iVar14 + open < 0) {
                iVar18 = open;
              }
              iVar10 = ppVar4->max;
              ppVar12 = parasail_result_new_table1((uint)((ulong)uVar24 + 7) & 0x7ffffff8,s2Len);
              if (ppVar12 != (parasail_result_t *)0x0) {
                ppVar12->flag = ppVar12->flag | 0x8220401;
                ptr = parasail_memalign___m128i(0x10,size);
                ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
                ptr_01 = parasail_memalign___m128i(0x10,size);
                ptr_02 = parasail_memalign___m128i(0x10,size);
                ptr_03 = parasail_memalign___m128i(0x10,size);
                if (ptr_03 != (__m128i *)0x0 &&
                    ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                    (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
                  iVar13 = s2Len + -1;
                  auVar31 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                  uVar30 = auVar31._0_4_;
                  auVar36._4_4_ = uVar30;
                  auVar36._0_4_ = uVar30;
                  auVar36._8_4_ = uVar30;
                  auVar36._12_4_ = uVar30;
                  auVar31 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                  uVar30 = auVar31._0_4_;
                  uVar24 = iVar18 - 0x7fff;
                  auVar32 = pshuflw(ZEXT416(uVar24),ZEXT416(uVar24),0);
                  auVar33._0_4_ = auVar32._0_4_;
                  auVar33._4_4_ = auVar33._0_4_;
                  auVar33._8_4_ = auVar33._0_4_;
                  auVar33._12_4_ = auVar33._0_4_;
                  auVar31 = ZEXT416(CONCAT22((short)((uint)iVar14 >> 0x10),0x7ffe - (short)iVar10));
                  auVar35 = pshuflw(auVar31,auVar31,0);
                  auVar31._0_4_ = auVar35._0_4_;
                  auVar31._4_4_ = auVar31._0_4_;
                  auVar31._8_4_ = auVar31._0_4_;
                  auVar31._12_4_ = auVar31._0_4_;
                  iVar14 = (int)size;
                  auVar37 = pshufb(ZEXT416((uint)-(iVar14 * gap)),_DAT_008a3bd0);
                  auVar37 = paddsw(auVar37,ZEXT416(uVar24 & 0xffff));
                  lVar20 = (long)iVar26;
                  for (uVar21 = 0; uVar21 != size; uVar21 = uVar21 + 1) {
                    lVar23 = lVar20;
                    for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
                      lVar27 = -0x8000;
                      if (-0x8000 < lVar23) {
                        lVar27 = lVar23;
                      }
                      lVar25 = lVar23 - (ulong)(uint)open;
                      if (lVar25 < -0x7fff) {
                        lVar25 = -0x8000;
                      }
                      *(short *)((long)&h + lVar19 * 2) = (short)lVar27;
                      *(short *)((long)&e + lVar19 * 2) = (short)lVar25;
                      lVar23 = lVar23 - size * (uint)gap;
                    }
                    ptr_02[uVar21][0] = h.m[0];
                    ptr_02[uVar21][1] = h.m[1];
                    ptr[uVar21][0] = e.m[0];
                    ptr[uVar21][1] = e.m[1];
                    lVar20 = lVar20 - (ulong)(uint)gap;
                  }
                  *ptr_00 = 0;
                  for (uVar21 = 1; s2Len + 1 != uVar21; uVar21 = uVar21 + 1) {
                    iVar16 = -0x8000;
                    if (-0x8000 < iVar26) {
                      iVar16 = (int16_t)iVar26;
                    }
                    ptr_00[uVar21] = iVar16;
                    iVar26 = iVar26 - gap;
                  }
                  alVar38 = (__m128i)psubsw((undefined1  [16])0x0,auVar36);
                  for (uVar17 = iVar14 - 1U; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
                    ptr_03[uVar17] = alVar38;
                    auVar39._4_4_ = uVar30;
                    auVar39._0_4_ = uVar30;
                    auVar39._8_4_ = uVar30;
                    auVar39._12_4_ = uVar30;
                    alVar38 = (__m128i)psubsw((undefined1  [16])alVar38,auVar39);
                  }
                  lVar20 = size * uVar22;
                  local_c0 = 0;
                  uVar21 = 0;
                  auVar39 = auVar33;
                  while (uVar21 != uVar22) {
                    uVar9 = ptr_02[iVar14 - 1U][0];
                    auVar43._8_8_ = ptr_02[iVar14 - 1U][1] << 0x10 | uVar9 >> 0x30;
                    auVar43._0_8_ = uVar9 << 0x10 | (ulong)(ushort)ptr_00[uVar21];
                    iVar18 = ppVar4->mapper[(byte)s2[uVar21]];
                    auVar42 = psubsw(auVar33,(undefined1  [16])*ptr_03);
                    lVar23 = 0;
                    auVar55 = auVar33;
                    while( true ) {
                      sVar29 = auVar55._0_2_;
                      sVar34 = auVar55._2_2_;
                      sVar45 = auVar55._4_2_;
                      sVar50 = auVar55._6_2_;
                      sVar51 = auVar55._8_2_;
                      sVar52 = auVar55._10_2_;
                      sVar53 = auVar55._12_2_;
                      sVar54 = auVar55._14_2_;
                      if (size << 4 == lVar23) break;
                      auVar48 = *(undefined1 (*) [16])((long)*ptr_02 + lVar23);
                      auVar7._4_4_ = uVar30;
                      auVar7._0_4_ = uVar30;
                      auVar7._8_4_ = uVar30;
                      auVar7._12_4_ = uVar30;
                      auVar55 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar23),auVar7);
                      auVar58 = psubsw(auVar48,auVar36);
                      auVar46 = paddsw(auVar43,*(undefined1 (*) [16])
                                                ((long)pvVar3 +
                                                lVar23 + (long)(iVar18 * iVar14) * 0x10));
                      auVar43 = paddsw(auVar42,*(undefined1 (*) [16])((long)*ptr_03 + lVar23));
                      sVar6 = auVar55._0_2_;
                      sVar57 = auVar58._0_2_;
                      uVar56 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57
                      ;
                      sVar6 = auVar55._2_2_;
                      sVar57 = auVar58._2_2_;
                      uVar59 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57
                      ;
                      sVar6 = auVar55._4_2_;
                      sVar57 = auVar58._4_2_;
                      uVar60 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57
                      ;
                      sVar6 = auVar55._6_2_;
                      sVar57 = auVar58._6_2_;
                      uVar61 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57
                      ;
                      sVar6 = auVar55._8_2_;
                      sVar57 = auVar58._8_2_;
                      uVar62 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57
                      ;
                      sVar6 = auVar55._10_2_;
                      sVar57 = auVar58._10_2_;
                      uVar63 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57
                      ;
                      sVar6 = auVar55._12_2_;
                      sVar57 = auVar58._12_2_;
                      sVar66 = auVar58._14_2_;
                      uVar64 = (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57
                      ;
                      sVar6 = auVar55._14_2_;
                      uVar65 = (ushort)(sVar66 < sVar6) * sVar6 | (ushort)(sVar66 >= sVar6) * sVar66
                      ;
                      sVar6 = auVar43._0_2_;
                      auVar55._0_2_ =
                           (ushort)(sVar29 < sVar6) * sVar6 | (ushort)(sVar29 >= sVar6) * sVar29;
                      sVar29 = auVar43._2_2_;
                      auVar55._2_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._4_2_;
                      auVar55._4_2_ =
                           (ushort)(sVar45 < sVar29) * sVar29 | (ushort)(sVar45 >= sVar29) * sVar45;
                      sVar29 = auVar43._6_2_;
                      auVar55._6_2_ =
                           (ushort)(sVar50 < sVar29) * sVar29 | (ushort)(sVar50 >= sVar29) * sVar50;
                      sVar29 = auVar43._8_2_;
                      auVar55._8_2_ =
                           (ushort)(sVar51 < sVar29) * sVar29 | (ushort)(sVar51 >= sVar29) * sVar51;
                      sVar29 = auVar43._10_2_;
                      auVar55._10_2_ =
                           (ushort)(sVar52 < sVar29) * sVar29 | (ushort)(sVar52 >= sVar29) * sVar52;
                      sVar29 = auVar43._12_2_;
                      auVar55._12_2_ =
                           (ushort)(sVar53 < sVar29) * sVar29 | (ushort)(sVar53 >= sVar29) * sVar53;
                      sVar29 = auVar43._14_2_;
                      auVar55._14_2_ =
                           (ushort)(sVar54 < sVar29) * sVar29 | (ushort)(sVar54 >= sVar29) * sVar54;
                      sVar29 = auVar46._0_2_;
                      auVar42._0_2_ =
                           (sVar29 < (short)uVar56) * uVar56 |
                           (ushort)(sVar29 >= (short)uVar56) * sVar29;
                      sVar29 = auVar46._2_2_;
                      auVar42._2_2_ =
                           (sVar29 < (short)uVar59) * uVar59 |
                           (ushort)(sVar29 >= (short)uVar59) * sVar29;
                      sVar29 = auVar46._4_2_;
                      auVar42._4_2_ =
                           (sVar29 < (short)uVar60) * uVar60 |
                           (ushort)(sVar29 >= (short)uVar60) * sVar29;
                      sVar29 = auVar46._6_2_;
                      auVar42._6_2_ =
                           (sVar29 < (short)uVar61) * uVar61 |
                           (ushort)(sVar29 >= (short)uVar61) * sVar29;
                      sVar29 = auVar46._8_2_;
                      auVar42._8_2_ =
                           (sVar29 < (short)uVar62) * uVar62 |
                           (ushort)(sVar29 >= (short)uVar62) * sVar29;
                      sVar29 = auVar46._10_2_;
                      auVar42._10_2_ =
                           (sVar29 < (short)uVar63) * uVar63 |
                           (ushort)(sVar29 >= (short)uVar63) * sVar29;
                      sVar29 = auVar46._12_2_;
                      sVar34 = auVar46._14_2_;
                      auVar42._12_2_ =
                           (sVar29 < (short)uVar64) * uVar64 |
                           (ushort)(sVar29 >= (short)uVar64) * sVar29;
                      auVar42._14_2_ =
                           (sVar34 < (short)uVar65) * uVar65 |
                           (ushort)(sVar34 >= (short)uVar65) * sVar34;
                      puVar1 = (ushort *)((long)*ptr + lVar23);
                      *puVar1 = uVar56;
                      puVar1[1] = uVar59;
                      puVar1[2] = uVar60;
                      puVar1[3] = uVar61;
                      puVar1[4] = uVar62;
                      puVar1[5] = uVar63;
                      puVar1[6] = uVar64;
                      puVar1[7] = uVar65;
                      *(undefined1 (*) [16])((long)*ptr_01 + lVar23) = auVar42;
                      lVar23 = lVar23 + 0x10;
                      auVar43 = auVar48;
                    }
                    auVar46._8_8_ = auVar42._8_8_ << 0x10 | auVar42._0_8_ >> 0x30;
                    uVar56 = ptr_00[uVar21 + 1];
                    auVar46._0_8_ = auVar42._0_8_ << 0x10 | (ulong)uVar56;
                    uVar21 = uVar21 + 1;
                    auVar43 = paddsw((undefined1  [16])*ptr_03,auVar46);
                    sVar6 = auVar43._0_2_;
                    auVar48._0_2_ =
                         (ushort)(sVar29 < sVar6) * sVar6 | (ushort)(sVar29 >= sVar6) * sVar29;
                    sVar29 = auVar43._2_2_;
                    auVar48._2_2_ =
                         (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                    sVar29 = auVar43._4_2_;
                    auVar48._4_2_ =
                         (ushort)(sVar45 < sVar29) * sVar29 | (ushort)(sVar45 >= sVar29) * sVar45;
                    sVar29 = auVar43._6_2_;
                    auVar48._6_2_ =
                         (ushort)(sVar50 < sVar29) * sVar29 | (ushort)(sVar50 >= sVar29) * sVar50;
                    sVar29 = auVar43._8_2_;
                    auVar48._8_2_ =
                         (ushort)(sVar51 < sVar29) * sVar29 | (ushort)(sVar51 >= sVar29) * sVar51;
                    sVar29 = auVar43._10_2_;
                    auVar48._10_2_ =
                         (ushort)(sVar52 < sVar29) * sVar29 | (ushort)(sVar52 >= sVar29) * sVar52;
                    sVar29 = auVar43._12_2_;
                    auVar48._12_2_ =
                         (ushort)(sVar53 < sVar29) * sVar29 | (ushort)(sVar53 >= sVar29) * sVar53;
                    sVar29 = auVar43._14_2_;
                    auVar48._14_2_ =
                         (ushort)(sVar54 < sVar29) * sVar29 | (ushort)(sVar54 >= sVar29) * sVar54;
                    iVar18 = 6;
                    while( true ) {
                      auVar58._0_8_ = auVar48._0_8_ << 0x10;
                      auVar58._8_8_ = auVar48._8_8_ << 0x10 | auVar48._0_8_ >> 0x30;
                      bVar28 = iVar18 == 0;
                      iVar18 = iVar18 + -1;
                      if (bVar28) break;
                      auVar43 = paddsw(auVar58,auVar37);
                      sVar29 = auVar43._0_2_;
                      sVar34 = auVar48._0_2_;
                      auVar49._0_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._2_2_;
                      sVar34 = auVar48._2_2_;
                      auVar49._2_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._4_2_;
                      sVar34 = auVar48._4_2_;
                      auVar49._4_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._6_2_;
                      sVar34 = auVar48._6_2_;
                      auVar49._6_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._8_2_;
                      sVar34 = auVar48._8_2_;
                      auVar49._8_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._10_2_;
                      sVar34 = auVar48._10_2_;
                      auVar49._10_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._12_2_;
                      sVar34 = auVar48._12_2_;
                      sVar45 = auVar48._14_2_;
                      auVar49._12_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._14_2_;
                      auVar49._14_2_ =
                           (ushort)(sVar45 < sVar29) * sVar29 | (ushort)(sVar45 >= sVar29) * sVar45;
                      auVar48 = auVar49;
                    }
                    auVar47 = paddsw(auVar58,ZEXT416(uVar24 & 0xffff));
                    sVar29 = auVar47._0_2_;
                    auVar44._0_2_ =
                         (ushort)((short)uVar56 < sVar29) * sVar29 |
                         ((short)uVar56 >= sVar29) * uVar56;
                    sVar29 = auVar47._2_2_;
                    sVar34 = auVar42._0_2_;
                    auVar44._2_2_ =
                         (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                    sVar29 = auVar47._4_2_;
                    sVar34 = auVar42._2_2_;
                    auVar44._4_2_ =
                         (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                    sVar29 = auVar47._6_2_;
                    sVar34 = auVar42._4_2_;
                    auVar44._6_2_ =
                         (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                    sVar29 = auVar47._8_2_;
                    sVar34 = auVar42._6_2_;
                    auVar44._8_2_ =
                         (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                    sVar29 = auVar47._10_2_;
                    sVar34 = auVar42._8_2_;
                    auVar44._10_2_ =
                         (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                    sVar29 = auVar47._12_2_;
                    sVar34 = auVar42._10_2_;
                    sVar45 = auVar42._12_2_;
                    auVar44._12_2_ =
                         (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                    sVar29 = auVar47._14_2_;
                    auVar44._14_2_ =
                         (ushort)(sVar45 < sVar29) * sVar29 | (ushort)(sVar45 >= sVar29) * sVar45;
                    lVar23 = local_c0;
                    for (lVar19 = 0; size << 4 != lVar19; lVar19 = lVar19 + 0x10) {
                      auVar8._4_4_ = uVar30;
                      auVar8._0_4_ = uVar30;
                      auVar8._8_4_ = uVar30;
                      auVar8._12_4_ = uVar30;
                      auVar55 = psubsw(auVar47,auVar8);
                      auVar43 = psubsw(auVar44,auVar36);
                      sVar29 = auVar43._0_2_;
                      sVar34 = auVar55._0_2_;
                      auVar47._0_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._2_2_;
                      sVar34 = auVar55._2_2_;
                      auVar47._2_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._4_2_;
                      sVar34 = auVar55._4_2_;
                      auVar47._4_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._6_2_;
                      sVar34 = auVar55._6_2_;
                      auVar47._6_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._8_2_;
                      sVar34 = auVar55._8_2_;
                      auVar47._8_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._10_2_;
                      sVar34 = auVar55._10_2_;
                      auVar47._10_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._12_2_;
                      sVar34 = auVar55._12_2_;
                      sVar45 = auVar55._14_2_;
                      auVar47._12_2_ =
                           (ushort)(sVar34 < sVar29) * sVar29 | (ushort)(sVar34 >= sVar29) * sVar34;
                      sVar29 = auVar43._14_2_;
                      auVar47._14_2_ =
                           (ushort)(sVar45 < sVar29) * sVar29 | (ushort)(sVar45 >= sVar29) * sVar45;
                      psVar2 = (short *)((long)*ptr_01 + lVar19);
                      sVar29 = *psVar2;
                      sVar34 = psVar2[1];
                      sVar45 = psVar2[2];
                      sVar50 = psVar2[3];
                      sVar51 = psVar2[4];
                      sVar52 = psVar2[5];
                      sVar53 = psVar2[6];
                      sVar54 = psVar2[7];
                      auVar44._0_2_ =
                           (sVar29 < (short)auVar47._0_2_) * auVar47._0_2_ |
                           (ushort)(sVar29 >= (short)auVar47._0_2_) * sVar29;
                      auVar44._2_2_ =
                           (sVar34 < (short)auVar47._2_2_) * auVar47._2_2_ |
                           (ushort)(sVar34 >= (short)auVar47._2_2_) * sVar34;
                      auVar44._4_2_ =
                           (sVar45 < (short)auVar47._4_2_) * auVar47._4_2_ |
                           (ushort)(sVar45 >= (short)auVar47._4_2_) * sVar45;
                      auVar44._6_2_ =
                           (sVar50 < (short)auVar47._6_2_) * auVar47._6_2_ |
                           (ushort)(sVar50 >= (short)auVar47._6_2_) * sVar50;
                      auVar44._8_2_ =
                           (sVar51 < (short)auVar47._8_2_) * auVar47._8_2_ |
                           (ushort)(sVar51 >= (short)auVar47._8_2_) * sVar51;
                      auVar44._10_2_ =
                           (sVar52 < (short)auVar47._10_2_) * auVar47._10_2_ |
                           (ushort)(sVar52 >= (short)auVar47._10_2_) * sVar52;
                      auVar44._12_2_ =
                           (sVar53 < (short)auVar47._12_2_) * auVar47._12_2_ |
                           (ushort)(sVar53 >= (short)auVar47._12_2_) * sVar53;
                      auVar44._14_2_ =
                           (sVar54 < (short)auVar47._14_2_) * auVar47._14_2_ |
                           (ushort)(sVar54 >= (short)auVar47._14_2_) * sVar54;
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar19) = auVar44;
                      sVar29 = auVar31._0_2_;
                      auVar41._0_2_ =
                           ((short)auVar44._0_2_ < sVar29) * auVar44._0_2_ |
                           (ushort)((short)auVar44._0_2_ >= sVar29) * sVar29;
                      sVar29 = auVar31._2_2_;
                      auVar41._2_2_ =
                           ((short)auVar44._2_2_ < sVar29) * auVar44._2_2_ |
                           (ushort)((short)auVar44._2_2_ >= sVar29) * sVar29;
                      sVar29 = auVar31._4_2_;
                      auVar41._4_2_ =
                           ((short)auVar44._4_2_ < sVar29) * auVar44._4_2_ |
                           (ushort)((short)auVar44._4_2_ >= sVar29) * sVar29;
                      sVar29 = auVar31._6_2_;
                      auVar41._6_2_ =
                           ((short)auVar44._6_2_ < sVar29) * auVar44._6_2_ |
                           (ushort)((short)auVar44._6_2_ >= sVar29) * sVar29;
                      sVar29 = auVar31._8_2_;
                      auVar41._8_2_ =
                           ((short)auVar44._8_2_ < sVar29) * auVar44._8_2_ |
                           (ushort)((short)auVar44._8_2_ >= sVar29) * sVar29;
                      sVar29 = auVar31._10_2_;
                      auVar41._10_2_ =
                           ((short)auVar44._10_2_ < sVar29) * auVar44._10_2_ |
                           (ushort)((short)auVar44._10_2_ >= sVar29) * sVar29;
                      sVar29 = auVar31._12_2_;
                      sVar34 = auVar31._14_2_;
                      auVar41._12_2_ =
                           ((short)auVar44._12_2_ < sVar29) * auVar44._12_2_ |
                           (ushort)((short)auVar44._12_2_ >= sVar29) * sVar29;
                      auVar41._14_2_ =
                           ((short)auVar44._14_2_ < sVar34) * auVar44._14_2_ |
                           (ushort)((short)auVar44._14_2_ >= sVar34) * sVar34;
                      sVar29 = auVar39._0_2_;
                      auVar40._0_2_ =
                           (sVar29 < (short)auVar44._0_2_) * auVar44._0_2_ |
                           (ushort)(sVar29 >= (short)auVar44._0_2_) * sVar29;
                      sVar29 = auVar39._2_2_;
                      auVar40._2_2_ =
                           (sVar29 < (short)auVar44._2_2_) * auVar44._2_2_ |
                           (ushort)(sVar29 >= (short)auVar44._2_2_) * sVar29;
                      sVar29 = auVar39._4_2_;
                      auVar40._4_2_ =
                           (sVar29 < (short)auVar44._4_2_) * auVar44._4_2_ |
                           (ushort)(sVar29 >= (short)auVar44._4_2_) * sVar29;
                      sVar29 = auVar39._6_2_;
                      auVar40._6_2_ =
                           (sVar29 < (short)auVar44._6_2_) * auVar44._6_2_ |
                           (ushort)(sVar29 >= (short)auVar44._6_2_) * sVar29;
                      sVar29 = auVar39._8_2_;
                      auVar40._8_2_ =
                           (sVar29 < (short)auVar44._8_2_) * auVar44._8_2_ |
                           (ushort)(sVar29 >= (short)auVar44._8_2_) * sVar29;
                      sVar29 = auVar39._10_2_;
                      auVar40._10_2_ =
                           (sVar29 < (short)auVar44._10_2_) * auVar44._10_2_ |
                           (ushort)(sVar29 >= (short)auVar44._10_2_) * sVar29;
                      sVar29 = auVar39._12_2_;
                      sVar34 = auVar39._14_2_;
                      auVar40._12_2_ =
                           (sVar29 < (short)auVar44._12_2_) * auVar44._12_2_ |
                           (ushort)(sVar29 >= (short)auVar44._12_2_) * sVar29;
                      auVar40._14_2_ =
                           (sVar34 < (short)auVar44._14_2_) * auVar44._14_2_ |
                           (ushort)(sVar34 >= (short)auVar44._14_2_) * sVar34;
                      piVar5 = ((ppVar12->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar23) = (int)(short)auVar44._0_2_;
                      *(int *)((long)piVar5 + lVar20 * 4 + lVar23) = (int)(short)auVar44._2_2_;
                      *(int *)((long)piVar5 + lVar20 * 8 + lVar23) = (int)(short)auVar44._4_2_;
                      *(int *)((long)piVar5 + lVar20 * 0xc + lVar23) = (int)(short)auVar44._6_2_;
                      *(int *)((long)piVar5 + lVar20 * 0x10 + lVar23) = (int)(short)auVar44._8_2_;
                      *(int *)((long)piVar5 + lVar20 * 0x14 + lVar23) = (int)(short)auVar44._10_2_;
                      *(int *)((long)piVar5 + lVar20 * 0x18 + lVar23) = (int)(short)auVar44._12_2_;
                      *(int *)((long)piVar5 + lVar20 * 0x1c + lVar23) = (int)(short)auVar44._14_2_;
                      lVar23 = lVar23 + uVar22 * 4;
                      auVar39 = auVar40;
                      auVar31 = auVar41;
                    }
                    local_c0 = local_c0 + 4;
                  }
                  alVar38 = ptr_02[(ulong)uVar11 % size];
                  iVar14 = 0;
                  while( true ) {
                    uVar22 = alVar38[0];
                    lVar20 = alVar38[1];
                    if (7 - (int)(uVar11 / size) <= iVar14) break;
                    alVar38[0] = uVar22 << 0x10;
                    alVar38[1] = lVar20 << 0x10 | uVar22 >> 0x30;
                    iVar14 = iVar14 + 1;
                  }
                  sVar29 = auVar32._0_2_;
                  auVar37._0_2_ = -(ushort)(auVar31._0_2_ < sVar29);
                  sVar34 = auVar32._2_2_;
                  auVar37._2_2_ = -(ushort)(auVar31._2_2_ < sVar34);
                  auVar37._4_2_ = -(ushort)(auVar31._4_2_ < sVar29);
                  auVar37._6_2_ = -(ushort)(auVar31._6_2_ < sVar34);
                  auVar37._8_2_ = -(ushort)(auVar31._8_2_ < sVar29);
                  auVar37._10_2_ = -(ushort)(auVar31._10_2_ < sVar34);
                  auVar37._12_2_ = -(ushort)(auVar31._12_2_ < sVar29);
                  auVar37._14_2_ = -(ushort)(auVar31._14_2_ < sVar34);
                  sVar29 = auVar35._0_2_;
                  auVar32._0_2_ = -(ushort)(sVar29 < auVar39._0_2_);
                  sVar34 = auVar35._2_2_;
                  auVar32._2_2_ = -(ushort)(sVar34 < auVar39._2_2_);
                  auVar32._4_2_ = -(ushort)(sVar29 < auVar39._4_2_);
                  auVar32._6_2_ = -(ushort)(sVar34 < auVar39._6_2_);
                  auVar32._8_2_ = -(ushort)(sVar29 < auVar39._8_2_);
                  auVar32._10_2_ = -(ushort)(sVar34 < auVar39._10_2_);
                  auVar32._12_2_ = -(ushort)(sVar29 < auVar39._12_2_);
                  auVar32._14_2_ = -(ushort)(sVar34 < auVar39._14_2_);
                  auVar32 = auVar32 | auVar37;
                  if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar32 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar32 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar32 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar32 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar32 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar32 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar32 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar32 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar32 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar32[0xf]) {
                    sVar29 = alVar38[1]._6_2_;
                  }
                  else {
                    *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                    sVar29 = 0;
                    iVar13 = 0;
                    uVar11 = 0;
                  }
                  ppVar12->score = (int)sVar29;
                  ppVar12->end_query = uVar11;
                  ppVar12->end_ref = iVar13;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  return ppVar12;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar15 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_scan_profile_sse41_128_16",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}